

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O2

void __thiscall ModuleTreeNode::~ModuleTreeNode(ModuleTreeNode *this)

{
  pointer ppMVar1;
  ModuleTreeNode *this_00;
  pointer ppMVar2;
  
  ppMVar1 = (this->submodules).
            super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar2 = (this->submodules).
                 super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppMVar2 != ppMVar1; ppMVar2 = ppMVar2 + 1) {
    this_00 = *ppMVar2;
    if (this_00 != (ModuleTreeNode *)0x0) {
      ~ModuleTreeNode(this_00);
    }
    operator_delete(this_00);
  }
  std::_Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>::~_Vector_base
            (&(this->submodules).
              super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>);
  std::
  _Rb_tree<long,_std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::~_Rb_tree(&(this->wire_names)._M_t);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

ModuleTreeNode::~ModuleTreeNode ()
{
  for (ModuleTreeNode* m : submodules) delete m;
}